

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O2

Graph * Omega_h::add_edges(Graph *__return_storage_ptr__,Graph *g1,Graph *g2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int j;
  long lVar10;
  ScopedTimer omega_h_scoped_function_timer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  Write<int> local_260;
  Write<int> local_250;
  Write<int> local_240;
  Write<int> local_230;
  LOs v2e;
  LOs e2v1;
  LOs v2e1;
  Write<int> e2v;
  LOs v2e2;
  Write<int> local_1b0;
  Write<int> local_1a0;
  Write<int> local_190;
  Write<int> local_180;
  Write<int> local_170;
  Write<int> local_160;
  Read<int> deg;
  Write<int> local_140;
  LOs deg2;
  Write<int> local_120;
  LOs deg1;
  LOs e2v2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Write<int> local_d0;
  Write<int> local_c0;
  Write<int> local_b0;
  Write<int> local_a0;
  type f;
  
  std::__cxx11::string::string
            ((string *)&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_graph.cpp"
             ,(allocator *)&e2v1);
  std::operator+(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 ":");
  std::__cxx11::to_string((string *)&v2e1,0xf);
  std::operator+(&local_280,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v2e1);
  begin_code("add_edges",local_280._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&v2e1);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&f);
  Write<int>::Write(&v2e1.write_,(Write<int> *)g1);
  Write<int>::Write(&e2v1.write_,&(g1->ab2b).write_);
  Write<int>::Write(&v2e2.write_,(Write<int> *)g2);
  Write<int>::Write(&e2v2.write_,&(g2->ab2b).write_);
  if (((ulong)v2e1.write_.shared_alloc_.alloc & 1) == 0) {
    uVar9 = (v2e1.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar9 = (ulong)v2e1.write_.shared_alloc_.alloc >> 3;
  }
  Write<int>::Write(&local_120,&v2e1.write_);
  std::__cxx11::string::string((string *)&local_280,"deg1",(allocator *)&local_f0);
  get_degrees((Omega_h *)&deg1,(LOs *)&local_120,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  Write<int>::~Write(&local_120);
  Write<int>::Write(&local_140,&v2e2.write_);
  std::__cxx11::string::string((string *)&local_280,"deg2",(allocator *)&local_f0);
  get_degrees((Omega_h *)&deg2,(LOs *)&local_140,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  Write<int>::~Write(&local_140);
  Write<int>::Write(&local_160,&deg1.write_);
  Write<int>::Write(&local_170,&deg2.write_);
  std::__cxx11::string::string((string *)&local_280,"deg1+2",(allocator *)&local_f0);
  add_each<int>((Omega_h *)&deg,(Read<int> *)&local_160,(Read<int> *)&local_170,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  Write<int>::~Write(&local_170);
  Write<int>::~Write(&local_160);
  Write<int>::Write(&local_180,&deg.write_);
  Read<int>::name_abi_cxx11_(&local_280,&v2e1);
  offset_scan<int>((Omega_h *)&v2e,(Read<int> *)&local_180,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  Write<int>::~Write(&local_180);
  iVar4 = Read<int>::last((Read<signed_char> *)&v2e);
  Read<int>::name_abi_cxx11_(&local_280,&e2v1);
  Write<int>::Write(&e2v,iVar4,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  Write<int>::Write((Write<int> *)&f,&v2e1.write_);
  Write<int>::Write(&f.v2e2.write_,&v2e2.write_);
  Write<int>::Write(&f.v2e.write_,&v2e.write_);
  Write<int>::Write(&f.e2v,&e2v);
  Write<int>::Write(&f.e2v1.write_,&e2v1.write_);
  Write<int>::Write(&f.e2v2.write_,&e2v2.write_);
  Write<int>::Write((Write<int> *)&local_f0,(Write<int> *)&f);
  Write<int>::Write((Write<int> *)&local_f0.field_2,&f.v2e2.write_);
  Write<int>::Write(&local_d0,&f.v2e.write_);
  Write<int>::Write(&local_c0,&f.e2v);
  Write<int>::Write(&local_b0,&f.e2v1.write_);
  Write<int>::Write(&local_a0,&f.e2v2.write_);
  if (1 < (int)(uVar9 >> 2)) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_280,(Write<int> *)&local_f0);
    Write<int>::Write((Write<int> *)&local_280.field_2,(Write<int> *)&local_f0.field_2);
    Write<int>::Write(&local_260,&local_d0);
    Write<int>::Write(&local_250,&local_c0);
    Write<int>::Write(&local_240,&local_b0);
    Write<int>::Write(&local_230,&local_a0);
    entering_parallel = 0;
    uVar8 = 0;
    while (uVar8 != ((uVar9 >> 2) + 0xffffffff & 0xffffffff)) {
      iVar4 = *(int *)(local_280._M_string_length + uVar8 * 4 + 4);
      lVar7 = (long)*(int *)(local_280.field_2._8_8_ + uVar8 * 4);
      iVar1 = *(int *)(local_280.field_2._8_8_ + 4 + uVar8 * 4);
      iVar2 = *(int *)((long)local_260.shared_alloc_.direct_ptr + uVar8 * 4);
      iVar3 = *(int *)((long)local_260.shared_alloc_.direct_ptr + uVar8 * 4 + 4);
      lVar6 = 0;
      lVar5 = (long)iVar2;
      for (lVar10 = (long)*(int *)(local_280._M_string_length + uVar8 * 4); lVar10 < iVar4;
          lVar10 = lVar10 + 1) {
        *(undefined4 *)((long)local_250.shared_alloc_.direct_ptr + lVar5 * 4) =
             *(undefined4 *)((long)local_240.shared_alloc_.direct_ptr + lVar10 * 4);
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 1;
      }
      for (; lVar7 < iVar1; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)local_250.shared_alloc_.direct_ptr + lVar6 * 4 + (long)iVar2 * 4) =
             *(undefined4 *)((long)local_230.shared_alloc_.direct_ptr + lVar7 * 4);
        lVar6 = lVar6 + 1;
      }
      uVar8 = uVar8 + 1;
      if (iVar3 - iVar2 != (int)lVar6) {
        fail("assertion %s failed at %s +%d\n","k == end",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_graph.cpp"
             ,0x24);
      }
    }
    add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)&local_280);
  }
  add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)&local_f0);
  Write<int>::Write(&local_190,&v2e.write_);
  Write<int>::Write(&local_1b0,&e2v);
  Read<int>::Read((Read<signed_char> *)&local_1a0,&local_1b0);
  Graph::Graph(__return_storage_ptr__,(LOs *)&local_190,(LOs *)&local_1a0);
  Write<int>::~Write(&local_1a0);
  Write<int>::~Write(&local_1b0);
  Write<int>::~Write(&local_190);
  add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&e2v);
  Write<int>::~Write(&v2e.write_);
  Write<int>::~Write(&deg.write_);
  Write<int>::~Write(&deg2.write_);
  Write<int>::~Write(&deg1.write_);
  Write<int>::~Write(&e2v2.write_);
  Write<int>::~Write(&v2e2.write_);
  Write<int>::~Write(&e2v1.write_);
  Write<int>::~Write(&v2e1.write_);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return __return_storage_ptr__;
}

Assistant:

Graph add_edges(Graph g1, Graph g2) {
  OMEGA_H_TIME_FUNCTION;
  auto v2e1 = g1.a2ab;
  auto e2v1 = g1.ab2b;
  auto v2e2 = g2.a2ab;
  auto e2v2 = g2.ab2b;
  auto nv = v2e1.size() - 1;
  auto deg1 = get_degrees(v2e1, "deg1");
  auto deg2 = get_degrees(v2e2, "deg2");
  auto deg = add_each(deg1, deg2, "deg1+2");
  auto v2e = offset_scan(deg, v2e1.name());
  Write<LO> e2v(v2e.last(), e2v1.name());
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto begin1 = v2e1[v];
    auto end1 = v2e1[v + 1];
    auto begin2 = v2e2[v];
    auto end2 = v2e2[v + 1];
    auto begin = v2e[v];
    auto end = v2e[v + 1];
    auto k = begin;
    for (auto j = begin1; j < end1; ++j) e2v[k++] = e2v1[j];
    for (auto j = begin2; j < end2; ++j) e2v[k++] = e2v2[j];
    OMEGA_H_CHECK(k == end);
  };
  parallel_for(nv, f, "add_edges");
  return Graph(v2e, e2v);
}